

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O3

bool __thiscall
cmAddSubDirectoryCommand::InitialPass
          (cmAddSubDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_type *psVar1;
  long *plVar2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  bool excludeFromAll;
  undefined8 uVar9;
  ulong uVar10;
  string *psVar11;
  string srcPath;
  string binPath;
  string binArg;
  string error;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  psVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 == psVar3) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  psVar11 = psVar6 + 1;
  excludeFromAll = false;
  if (psVar11 != psVar3) {
    do {
      iVar5 = std::__cxx11::string::compare((char *)psVar11);
      if (iVar5 == 0) {
        excludeFromAll = true;
      }
      else {
        if (local_1e8._M_string_length != 0) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"called with incorrect number of arguments","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          bVar4 = false;
          goto LAB_001cd53b;
        }
        std::__cxx11::string::_M_assign((string *)&local_1e8);
      }
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar3);
  }
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  bVar4 = cmsys::SystemTools::FileIsFullPath(psVar6);
  if (bVar4) {
    std::__cxx11::string::_M_assign((string *)&local_248);
  }
  else {
    cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::_M_assign((string *)&local_248);
    std::__cxx11::string::append((char *)&local_248);
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)(psVar6->_M_dataplus)._M_p);
  }
  bVar4 = cmsys::SystemTools::FileIsDirectory(&local_248);
  if (!bVar4) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"given source \"","");
    std::__cxx11::string::_M_append(local_1a8,(ulong)(psVar6->_M_dataplus)._M_p);
    std::__cxx11::string::append(local_1a8);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar4 = false;
    goto LAB_001cd524;
  }
  cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_248);
  std::__cxx11::string::operator=((string *)&local_248,(string *)local_1a8);
  plVar2 = (long *)(local_1a8 + 0x10);
  if ((long *)local_1a8._0_8_ != plVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  if (local_1e8._M_string_length == 0) {
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    bVar4 = cmsys::SystemTools::IsSubDirectory(&local_248,psVar6);
    if (bVar4) {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::substr((ulong)&local_208,(ulong)psVar6);
      std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&local_248);
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        uVar9 = local_208.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_1c0 + local_208._M_string_length) {
        uVar10 = 0xf;
        if (local_1c8 != local_1b8) {
          uVar10 = local_1b8[0];
        }
        if (uVar10 < local_1c0 + local_208._M_string_length) goto LAB_001cd3cf;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
      }
      else {
LAB_001cd3cf:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1c8);
      }
      psVar1 = puVar8 + 2;
      if ((size_type *)*puVar8 == psVar1) {
        local_1a8._16_8_ = *psVar1;
        local_1a8._24_8_ = puVar8[3];
        local_1a8._0_8_ = plVar2;
      }
      else {
        local_1a8._16_8_ = *psVar1;
        local_1a8._0_8_ = (size_type *)*puVar8;
      }
      local_1a8._8_8_ = puVar8[1];
      *puVar8 = psVar1;
      puVar8[1] = 0;
      *(undefined1 *)psVar1 = 0;
      std::__cxx11::string::operator=((string *)&local_228,(string *)local_1a8);
      if ((long *)local_1a8._0_8_ != plVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001cd4a7;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"not given a binary directory but the given source directory ",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is not a subdirectory of \"",0x1c)
    ;
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"When specifying an out-of-tree source a binary directory ",0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"must be explicitly specified.",0x1d);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar4 = false;
  }
  else {
    bVar4 = cmsys::SystemTools::FileIsFullPath(&local_1e8);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_228);
    }
    else {
      cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::_M_assign((string *)&local_228);
      std::__cxx11::string::append((char *)&local_228);
      std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1e8._M_dataplus._M_p);
    }
LAB_001cd4a7:
    cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_228);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_1a8);
    if ((long *)local_1a8._0_8_ != plVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar4 = true;
    cmMakefile::AddSubDirectory
              ((this->super_cmCommand).Makefile,&local_248,&local_228,excludeFromAll,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
LAB_001cd524:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
LAB_001cd53b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool cmAddSubDirectoryCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the binpath
  std::string const& srcArg = args.front();
  std::string binArg;

  bool excludeFromAll = false;

  // process the rest of the arguments looking for optional args
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = arg;
    } else {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg)) {
    srcPath = srcArg;
  } else {
    srcPath = this->Makefile->GetCurrentSourceDirectory();
    srcPath += "/";
    srcPath += srcArg;
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = "given source \"";
    error += srcArg;
    error += "\" which is not an existing directory.";
    this->SetError(error);
    return false;
  }
  srcPath = cmSystemTools::CollapseFullPath(srcPath);

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(
          srcPath, this->Makefile->GetCurrentSourceDirectory())) {
      std::ostringstream e;
      e << "not given a binary directory but the given source directory "
        << "\"" << srcPath << "\" is not a subdirectory of \""
        << this->Makefile->GetCurrentSourceDirectory() << "\".  "
        << "When specifying an out-of-tree source a binary directory "
        << "must be explicitly specified.";
      this->SetError(e.str());
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const std::string& src = this->Makefile->GetCurrentSourceDirectory();
    const std::string& bin = this->Makefile->GetCurrentBinaryDirectory();
    size_t srcLen = src.length();
    size_t binLen = bin.length();
    if (srcLen > 0 && src.back() == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin.back() == '/') {
      --binLen;
    }
    binPath = bin.substr(0, binLen) + srcPath.substr(srcLen);
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg)) {
      binPath = binArg;
    } else {
      binPath = this->Makefile->GetCurrentBinaryDirectory();
      binPath += "/";
      binPath += binArg;
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, true);

  return true;
}